

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_open_bound(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  undefined8 uVar3;
  undefined1 *puVar4;
  ulong unaff_RBX;
  undefined1 *puVar5;
  sockaddr_in addr;
  uv_udp_t client;
  undefined1 auStack_578 [16];
  sockaddr sStack_568;
  undefined2 uStack_558;
  undefined1 uStack_556;
  undefined5 uStack_555;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined6 uStack_510;
  undefined2 uStack_50a;
  undefined6 uStack_508;
  undefined8 uStack_502;
  undefined1 auStack_4f8 [216];
  undefined1 auStack_420 [320];
  ulong uStack_2e0;
  undefined1 auStack_2d0 [16];
  sockaddr sStack_2c0;
  undefined1 auStack_2b0 [96];
  long lStack_250;
  undefined1 auStack_1d8 [216];
  code *pcStack_100;
  sockaddr local_f0;
  undefined1 local_e0 [216];
  
  pcStack_100 = (code *)0x17b25b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  if (iVar1 == 0) {
    pcStack_100 = (code *)0x17b268;
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    pcStack_100 = (code *)0x17b27b;
    iVar1 = bind(uVar2,&local_f0,0x10);
    if (iVar1 != 0) goto LAB_0017b32c;
    pcStack_100 = (code *)0x17b288;
    uVar3 = uv_default_loop();
    pcStack_100 = (code *)0x17b295;
    iVar1 = uv_udp_init(uVar3,local_e0);
    if (iVar1 != 0) goto LAB_0017b331;
    pcStack_100 = (code *)0x17b2a9;
    iVar1 = uv_udp_open(local_e0,uVar2);
    if (iVar1 != 0) goto LAB_0017b336;
    pcStack_100 = (code *)0x17b2c9;
    iVar1 = uv_udp_recv_start(local_e0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_0017b33b;
    pcStack_100 = (code *)0x17b2d9;
    uv_close(local_e0,0);
    pcStack_100 = (code *)0x17b2de;
    uVar3 = uv_default_loop();
    pcStack_100 = (code *)0x17b2e8;
    uv_run(uVar3,0);
    pcStack_100 = (code *)0x17b2ed;
    unaff_RBX = uv_default_loop();
    pcStack_100 = (code *)0x17b301;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_100 = (code *)0x17b30b;
    uv_run(unaff_RBX,0);
    pcStack_100 = (code *)0x17b310;
    uVar3 = uv_default_loop();
    pcStack_100 = (code *)0x17b318;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x17b32c;
    run_test_udp_open_bound_cold_1();
LAB_0017b32c:
    pcStack_100 = (code *)0x17b331;
    run_test_udp_open_bound_cold_2();
LAB_0017b331:
    pcStack_100 = (code *)0x17b336;
    run_test_udp_open_bound_cold_3();
LAB_0017b336:
    pcStack_100 = (code *)0x17b33b;
    run_test_udp_open_bound_cold_4();
LAB_0017b33b:
    pcStack_100 = (code *)0x17b340;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_100 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_100 = (code *)unaff_RBX;
  auStack_2d0 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2c0);
  if (iVar1 == 0) {
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,auStack_2b0);
    if (iVar1 != 0) goto LAB_0017b4ca;
    iVar1 = connect(uVar2,&sStack_2c0,0x10);
    if (iVar1 != 0) goto LAB_0017b4cf;
    iVar1 = uv_udp_open(auStack_2b0,uVar2);
    if (iVar1 != 0) goto LAB_0017b4d4;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,auStack_1d8);
    if (iVar1 != 0) goto LAB_0017b4d9;
    iVar1 = uv_udp_bind(auStack_1d8,&sStack_2c0,0);
    if (iVar1 != 0) goto LAB_0017b4de;
    iVar1 = uv_udp_recv_start(auStack_1d8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_0017b4e3;
    iVar1 = uv_udp_send(&send_req,auStack_2b0,auStack_2d0,1,0,send_cb);
    if (iVar1 != 0) goto LAB_0017b4e8;
    uVar3 = uv_default_loop();
    uv_run(uVar3,0);
    if (send_cb_called != 1) goto LAB_0017b4ed;
    if (close_cb_called != 2) goto LAB_0017b4f2;
    if (lStack_250 != 0) goto LAB_0017b4f7;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_open_connect_cold_1();
LAB_0017b4ca:
    run_test_udp_open_connect_cold_2();
LAB_0017b4cf:
    run_test_udp_open_connect_cold_3();
LAB_0017b4d4:
    run_test_udp_open_connect_cold_4();
LAB_0017b4d9:
    run_test_udp_open_connect_cold_5();
LAB_0017b4de:
    run_test_udp_open_connect_cold_6();
LAB_0017b4e3:
    run_test_udp_open_connect_cold_7();
LAB_0017b4e8:
    run_test_udp_open_connect_cold_8();
LAB_0017b4ed:
    run_test_udp_open_connect_cold_9();
LAB_0017b4f2:
    run_test_udp_open_connect_cold_10();
LAB_0017b4f7:
    run_test_udp_open_connect_cold_11();
  }
  run_test_udp_open_connect_cold_12();
  uStack_2e0 = unaff_RBX;
  auStack_578 = uv_buf_init("PING",4);
  puVar4 = (undefined1 *)uv_default_loop();
  uStack_555 = 0;
  uStack_550 = 0;
  uStack_548 = 0;
  uStack_540 = 0;
  uStack_538 = 0;
  uStack_530 = 0;
  uStack_528 = 0;
  uStack_520 = 0;
  uStack_518 = 0;
  uStack_510 = 0;
  uStack_50a = 0;
  uStack_508 = 0;
  uStack_502 = 0;
  sStack_568.sa_family = 1;
  builtin_strncpy(sStack_568.sa_data,"/tmp/uv-test-s",0xe);
  uStack_558 = 0x636f;
  uStack_556 = 0x6b;
  puVar5 = (undefined1 *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_0017b695:
    run_test_udp_send_unix_cold_2();
LAB_0017b69a:
    run_test_udp_send_unix_cold_3();
LAB_0017b69f:
    run_test_udp_send_unix_cold_4();
LAB_0017b6a4:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar5 = (undefined1 *)(ulong)uVar2;
    iVar1 = bind(uVar2,&sStack_568,0x6e);
    if (iVar1 != 0) goto LAB_0017b695;
    puVar5 = (undefined1 *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_0017b69a;
    puVar5 = puVar4;
    iVar1 = uv_udp_init(puVar4,auStack_4f8);
    if (iVar1 != 0) goto LAB_0017b69f;
    puVar5 = auStack_4f8;
    iVar1 = uv_udp_open(puVar5,uVar2);
    if (iVar1 != 0) goto LAB_0017b6a4;
    uv_run(puVar4,0);
    puVar5 = auStack_420;
    iVar1 = uv_udp_send(puVar5,auStack_4f8,auStack_578,1,&sStack_568,0);
    if (iVar1 == 0) {
      uv_close(auStack_4f8,0);
      uv_run(puVar4,0);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar5 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017b6ae;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_0017b6ae:
  run_test_udp_send_unix_cold_7();
  if (puVar5 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar5,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open_bound) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = bind(sock, (struct sockaddr*) &addr, sizeof(addr));
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}